

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mem_pass.cpp
# Opt level: O2

Instruction * __thiscall
spvtools::opt::MemPass::GetPtr(MemPass *this,Instruction *ip,uint32_t *varId)

{
  bool bVar1;
  uint32_t ptrId;
  Instruction *pIVar2;
  
  if (2 < ip->opcode_ - OpImageTexelPointer) {
    bVar1 = Instruction::IsAtomicWithLoad(ip);
    if (!bVar1) {
      __assert_fail("ip->opcode() == spv::Op::OpStore || ip->opcode() == spv::Op::OpLoad || ip->opcode() == spv::Op::OpImageTexelPointer || ip->IsAtomicWithLoad()"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/mem_pass.cpp"
                    ,0x83,"Instruction *spvtools::opt::MemPass::GetPtr(Instruction *, uint32_t *)");
    }
  }
  ptrId = Instruction::GetSingleWordInOperand(ip,0);
  pIVar2 = GetPtr(this,ptrId,varId);
  return pIVar2;
}

Assistant:

Instruction* MemPass::GetPtr(Instruction* ip, uint32_t* varId) {
  assert(ip->opcode() == spv::Op::OpStore || ip->opcode() == spv::Op::OpLoad ||
         ip->opcode() == spv::Op::OpImageTexelPointer ||
         ip->IsAtomicWithLoad());

  // All of these opcode place the pointer in position 0.
  const uint32_t ptrId = ip->GetSingleWordInOperand(0);
  return GetPtr(ptrId, varId);
}